

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaItemListAddSize(xmlSchemaItemListPtr list,int initialSize,void *item)

{
  int iVar1;
  
  iVar1 = list->nbItems;
  if (list->sizeItems <= iVar1) {
    iVar1 = xmlSchemaItemListGrow(list,initialSize);
    if (iVar1 < 0) {
      xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0);
      return -1;
    }
    iVar1 = list->nbItems;
  }
  list->nbItems = iVar1 + 1;
  list->items[iVar1] = item;
  return 0;
}

Assistant:

static int
xmlSchemaItemListAddSize(xmlSchemaItemListPtr list,
			 int initialSize,
			 void *item)
{
    if (list->sizeItems <= list->nbItems) {
        if (xmlSchemaItemListGrow(list, initialSize) < 0) {
	    xmlSchemaPErrMemory(NULL);
	    return(-1);
        }
    }

    list->items[list->nbItems++] = item;
    return(0);
}